

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

uint32_t lzma_mf_bt2_find(lzma_mf *mf,lzma_match *matches)

{
  ushort uVar1;
  uint uVar2;
  uint8_t *puVar3;
  lzma_match *plVar4;
  uint uVar5;
  uint32_t pos;
  uint len_limit;
  uint32_t uVar6;
  
  uVar2 = mf->read_pos;
  uVar5 = mf->write_pos - uVar2;
  len_limit = mf->nice_len;
  if ((uVar5 < mf->nice_len) && ((uVar5 < 2 || (len_limit = uVar5, mf->action == LZMA_SYNC_FLUSH))))
  {
    if (mf->action == LZMA_RUN) {
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x27b,"uint32_t lzma_mf_bt2_find(lzma_mf *, lzma_match *)");
    }
    move_pending(mf);
    uVar6 = 0;
  }
  else {
    puVar3 = mf->buffer;
    pos = mf->offset + uVar2;
    uVar1 = *(ushort *)(puVar3 + uVar2);
    uVar6 = mf->hash[uVar1];
    mf->hash[uVar1] = pos;
    plVar4 = bt_find_func(len_limit,pos,puVar3 + uVar2,uVar6,mf->depth,mf->son,mf->cyclic_pos,
                          mf->cyclic_size,matches,1);
    uVar6 = (uint32_t)((ulong)((long)plVar4 - (long)matches) >> 3);
    move_pos(mf);
  }
  return uVar6;
}

Assistant:

extern uint32_t
lzma_mf_bt2_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t hash_value; /* hash_2_calc */
	uint32_t cur_match;
	uint32_t matches_count = 0;

	header_find(true, 2);

	hash_2_calc();

	cur_match = mf->hash[hash_value];
	mf->hash[hash_value] = pos;

	bt_find(1);
}